

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O1

vector<std::shared_ptr<ylt::metric::static_metric>,_std::allocator<std::shared_ptr<ylt::metric::static_metric>_>_>
* __thiscall
ylt::metric::static_metric_manager<test_id_t<9UL>_>::get_metric_by_label
          (vector<std::shared_ptr<ylt::metric::static_metric>,_std::allocator<std::shared_ptr<ylt::metric::static_metric>_>_>
           *__return_storage_ptr__,static_metric_manager<test_id_t<9UL>_> *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *labels)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  bool bVar3;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<ylt::metric::static_metric>,_std::allocator<std::shared_ptr<ylt::metric::static_metric>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<ylt::metric::static_metric>,_std::allocator<std::shared_ptr<ylt::metric::static_metric>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<ylt::metric::static_metric>,_std::allocator<std::shared_ptr<ylt::metric::static_metric>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var1 = (this->metric_map_)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    p_Var2 = p_Var1[5]._M_nxt;
    if ((p_Var2[0xf]._M_nxt ==
         (_Hash_node_base *)(labels->_M_t)._M_impl.super__Rb_tree_header._M_node_count) &&
       (bVar3 = std::__equal<false>::
                equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          ((_Base_ptr)p_Var2[0xd]._M_nxt,(_Base_ptr)(p_Var2 + 0xb),
                           (labels->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left), bVar3))
    {
      std::
      vector<std::shared_ptr<ylt::metric::static_metric>,_std::allocator<std::shared_ptr<ylt::metric::static_metric>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)(p_Var1 + 5));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<static_metric>> get_metric_by_label(
      const std::map<std::string, std::string>& labels) {
    std::vector<std::shared_ptr<static_metric>> metrics;

    for (auto& [key, m] : metric_map_) {
      if (m->get_static_labels() == labels) {
        metrics.push_back(m);
      }
    }

    return metrics;
  }